

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

Marray<int,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::operator=
          (Marray<int,std::allocator<unsigned_long>> *this,
          View<int,_false,_std::allocator<unsigned_long>_> *in)

{
  reference piVar1;
  pointer piVar2;
  size_t *psVar3;
  size_t *psVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  reference piVar9;
  reference piVar10;
  int *piVar11;
  unsigned_long *puVar12;
  reference piVar13;
  size_t sVar14;
  reference piVar15;
  runtime_error *this_00;
  ulong uVar16;
  void *dataPointer_;
  void *vDataPointer_;
  Marray<int,_std::allocator<unsigned_long>_> m;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_70;
  long local_40;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
  if ((View<int,_false,_std::allocator<unsigned_long>_> *)this != in) {
    if (in->data_ != (pointer)0x0) {
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
      piVar13 = *(reference *)this;
      if ((piVar13 != (reference)0x0) && (piVar1 = in->data_, piVar1 != (reference)0x0)) {
        piVar9 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)this,
                            *(long *)(this + 0x30) - 1);
        piVar10 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                            (in,(in->geometry_).size_ - 1);
        if (((piVar13 <= piVar1) && (piVar1 <= piVar9)) ||
           ((piVar1 <= piVar13 && (piVar13 <= piVar10)))) {
          Marray<int,false,std::allocator<unsigned_long>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_70,in);
          Marray<int,_std::allocator<unsigned_long>_>::operator=
                    ((Marray<int,_std::allocator<unsigned_long>_> *)this,
                     (Marray<int,_std::allocator<unsigned_long>_> *)&local_70);
          operator_delete((void *)CONCAT44(local_70.view_._4_4_,local_70.view_._0_4_),local_40 << 2)
          ;
          uVar16 = (long)local_70.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage * 0x18;
LAB_002304d7:
          operator_delete((void *)local_70.index_,uVar16);
          goto LAB_002306af;
        }
      }
      if (*(size_t *)(this + 0x30) != (in->geometry_).size_) {
        operator_delete(*(void **)this,*(size_t *)(this + 0x30) << 2);
        piVar11 = __gnu_cxx::new_allocator<int>::allocate
                            ((new_allocator<int> *)(this + 0x40),(in->geometry_).size_,(void *)0x0);
        *(int **)this = piVar11;
      }
      if (in->data_ == (pointer)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      else {
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
                  ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),(in->geometry_).dimension_
                  );
        piVar2 = in->data_;
        if (piVar2 != (pointer)0x0) {
          psVar3 = (in->geometry_).shape_;
          psVar4 = (in->geometry_).shapeStrides_;
          lVar5 = *(long *)(this + 0x10);
          lVar6 = *(long *)(this + 0x18);
          lVar7 = *(long *)(this + 0x20);
          uVar16 = 0;
LAB_00230542:
          if (uVar16 < (in->geometry_).dimension_) {
            if (uVar16 < (in->geometry_).dimension_) {
              if (uVar16 < *(ulong *)(this + 0x28)) {
                *(size_t *)(lVar5 + uVar16 * 8) = psVar3[uVar16];
                if (uVar16 < (in->geometry_).dimension_) {
                  if (uVar16 < *(ulong *)(this + 0x28)) {
                    *(size_t *)(lVar6 + uVar16 * 8) = psVar4[uVar16];
                    if (uVar16 < (in->geometry_).dimension_) {
                      if (uVar16 < *(ulong *)(this + 0x28)) goto code_r0x00230594;
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,"Assertion failed.");
                    }
                    else {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,"Assertion failed.");
                    }
                  }
                  else {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,"Assertion failed.");
                  }
                }
                else {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_00,"Assertion failed.");
                }
              }
              else {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"Assertion failed.");
              }
            }
            else {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
            }
            goto LAB_00230a8a;
          }
          *(size_t *)(this + 0x30) = (in->geometry_).size_;
          this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
          View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
          *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
          View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
          if ((in->geometry_).isSimple_ != false) {
            memcpy(*(void **)this,in->data_,(in->geometry_).size_ << 2);
            goto LAB_002306af;
          }
          if (in->data_ != (pointer)0x0) {
            sVar14 = (in->geometry_).dimension_;
            if (sVar14 == 3) {
              uVar8 = *(undefined8 *)this;
              local_70.view_._0_4_ = 0;
              piVar13 = marray_detail::AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
              marray_detail::
              OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(this,in,uVar8,piVar13);
            }
            else if (sVar14 == 2) {
              uVar8 = *(undefined8 *)this;
              local_70.view_._0_4_ = 0;
              piVar13 = marray_detail::AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
              marray_detail::
              OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(this,in,uVar8,piVar13);
            }
            else if (sVar14 == 1) {
              piVar11 = *(int **)this;
              local_70.view_._0_4_ = 0;
              piVar13 = marray_detail::AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
              sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                                 ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
              if (sVar14 != 0) {
                uVar16 = 0;
                do {
                  *piVar11 = *piVar13;
                  sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                     ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                  piVar11 = piVar11 + sVar14;
                  sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::strides(in,0);
                  piVar13 = piVar13 + sVar14;
                  uVar16 = uVar16 + 1;
                  sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                                     ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                } while (uVar16 < sVar14);
              }
              View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
              View<int,_false,_std::allocator<unsigned_long>_>::strides
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
              View<int,_false,_std::allocator<unsigned_long>_>::shape(in,0);
              View<int,_false,_std::allocator<unsigned_long>_>::strides(in,0);
            }
            else {
              sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
              if (sVar14 == 4) {
                uVar8 = *(undefined8 *)this;
                local_70.view_._0_4_ = 0;
                piVar13 = marray_detail::AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
                marray_detail::
                OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(this,in,uVar8,piVar13);
              }
              else {
                sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                if (sVar14 == 5) {
                  uVar8 = *(undefined8 *)this;
                  local_70.view_._0_4_ = 0;
                  piVar13 = marray_detail::AccessOperatorHelper<true>::
                            execute<int,int,false,std::allocator<unsigned_long>>
                                      (in,(int *)&local_70);
                  marray_detail::
                  OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(this,in,uVar8,piVar13);
                }
                else {
                  sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                  if (sVar14 == 6) {
                    uVar8 = *(undefined8 *)this;
                    local_70.view_._0_4_ = 0;
                    piVar13 = marray_detail::AccessOperatorHelper<true>::
                              execute<int,int,false,std::allocator<unsigned_long>>
                                        (in,(int *)&local_70);
                    marray_detail::
                    OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(this,in,uVar8,piVar13);
                  }
                  else {
                    sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                    if (sVar14 == 7) {
                      uVar8 = *(undefined8 *)this;
                      local_70.view_._0_4_ = 0;
                      piVar13 = marray_detail::AccessOperatorHelper<true>::
                                execute<int,int,false,std::allocator<unsigned_long>>
                                          (in,(int *)&local_70);
                      marray_detail::
                      OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(this,in,uVar8,piVar13);
                    }
                    else {
                      sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                      if (sVar14 == 8) {
                        uVar8 = *(undefined8 *)this;
                        local_70.view_._0_4_ = 0;
                        piVar13 = marray_detail::AccessOperatorHelper<true>::
                                  execute<int,int,false,std::allocator<unsigned_long>>
                                            (in,(int *)&local_70);
                        marray_detail::
                        OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(this,in,uVar8,piVar13);
                      }
                      else {
                        sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                        if (sVar14 == 9) {
                          uVar8 = *(undefined8 *)this;
                          local_70.view_._0_4_ = 0;
                          piVar13 = marray_detail::AccessOperatorHelper<true>::
                                    execute<int,int,false,std::allocator<unsigned_long>>
                                              (in,(int *)&local_70);
                          marray_detail::
                          OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(this,in,uVar8,piVar13);
                        }
                        else {
                          sVar14 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                          if (sVar14 != 10) {
                            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
                            Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                      (&local_70,in,0);
                            for (uVar16 = 0; uVar16 < *(ulong *)(this + 0x30); uVar16 = uVar16 + 1)
                            {
                              piVar15 = Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                        operator*(&local_70);
                              *(int *)(*(long *)this + uVar16 * 4) = *piVar15;
                              Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                        (&local_70);
                            }
                            if (local_70.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start == (pointer)0x0)
                            goto LAB_002306af;
                            uVar16 = (long)local_70.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)local_70.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                            local_70.index_ =
                                 (size_t)local_70.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                            goto LAB_002304d7;
                          }
                          uVar8 = *(undefined8 *)this;
                          local_70.view_._0_4_ = 0;
                          piVar13 = marray_detail::AccessOperatorHelper<true>::
                                    execute<int,int,false,std::allocator<unsigned_long>>
                                              (in,(int *)&local_70);
                          marray_detail::
                          OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(this,in,uVar8,piVar13);
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_002306af;
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_00230a8a;
        }
LAB_002305a4:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      goto LAB_00230a8a;
    }
    operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
    *(undefined8 *)this = 0;
    if (in != (View<int,_false,_std::allocator<unsigned_long>_> *)this) {
      if ((in->geometry_).dimension_ != *(size_t *)(this + 0x28)) {
        operator_delete(*(void **)(this + 0x10),*(size_t *)(this + 0x28) * 0x18);
        sVar14 = (in->geometry_).dimension_;
        *(size_t *)(this + 0x28) = sVar14;
        puVar12 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                            ((new_allocator<unsigned_long> *)(this + 8),sVar14 * 3,(void *)0x0);
        *(unsigned_long **)(this + 0x10) = puVar12;
        *(unsigned_long **)(this + 0x18) = puVar12 + *(long *)(this + 0x28);
        *(unsigned_long **)(this + 0x20) = puVar12 + *(long *)(this + 0x28) + *(long *)(this + 0x28)
        ;
        *(size_t *)(this + 0x28) = (in->geometry_).dimension_;
      }
      memcpy(*(void **)(this + 0x10),(in->geometry_).shape_,*(long *)(this + 0x28) * 0x18);
      *(size_t *)(this + 0x30) = (in->geometry_).size_;
      *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
      this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)(in->geometry_).isSimple_;
    }
  }
LAB_002306af:
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<int,std::allocator<unsigned_long>>)0x0) {
    return (Marray<int,_std::allocator<unsigned_long>_> *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00230a8a:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
code_r0x00230594:
  *(size_t *)(lVar7 + uVar16 * 8) = psVar4[uVar16];
  uVar16 = uVar16 + 1;
  if (piVar2 == (pointer)0x0) goto LAB_002305a4;
  goto LAB_00230542;
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const View<TLocal, isConstLocal, ALocal>& in
)
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if( (void*)(this) != (void*)(&in) ) { // no self-assignment
        if(in.data_ == 0) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
            this->geometry_ = in.geometry_;
        }
        else if(this->overlaps(in)) {
            Marray<T, A> m = in; // temporary copy
            (*this) = m;
        }
        else {
            // re-alloc memory if necessary
            if(this->size() != in.size()) {
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }

            // copy geometry
            this->geometry_.resize(in.dimension());
            for(std::size_t j=0; j<in.dimension(); ++j) {
                this->geometry_.shape(j) = in.geometry_.shape(j);
                this->geometry_.shapeStrides(j) = in.geometry_.shapeStrides(j);
                this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
            }
            this->geometry_.size() = in.size();
            this->geometry_.isSimple() = true;
            this->geometry_.coordinateOrder() = in.coordinateOrder();

            // copy data
            if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
                memcpy(this->data_, in.data_, (in.size())*sizeof(T));
            }
            else if(in.dimension() == 1)
                marray_detail::OperateHelperBinary<1, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 2)
                marray_detail::OperateHelperBinary<2, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 3)
                marray_detail::OperateHelperBinary<3, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 4)
                marray_detail::OperateHelperBinary<4, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 5)
                marray_detail::OperateHelperBinary<5, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 6)
                marray_detail::OperateHelperBinary<6, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 7)
                marray_detail::OperateHelperBinary<7, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 8)
                marray_detail::OperateHelperBinary<8, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 9)
                marray_detail::OperateHelperBinary<9, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 10)
                marray_detail::OperateHelperBinary<10, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else {
                typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
                for(std::size_t j=0; j<this->size(); ++j, ++it) {
                    this->data_[j] = static_cast<T>(*it);
                }
            }
        }
    }
    testInvariant();
    return *this;
}